

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::FileStream::FileStream(FileStream *this,string *filename)

{
  byte bVar1;
  undefined8 uVar2;
  ostream *poVar3;
  domain_error *this_00;
  string *in_RSI;
  IStream *in_RDI;
  ostringstream oss;
  string local_1b8 [32];
  ostringstream local_198 [392];
  string *local_10;
  
  local_10 = in_RSI;
  IStream::IStream(in_RDI);
  in_RDI->_vptr_IStream = (_func_int **)&PTR__FileStream_001f07d0;
  std::ofstream::ofstream(in_RDI + 1);
  uVar2 = std::__cxx11::string::c_str();
  std::ofstream::open(in_RDI + 1,uVar2,0x10);
  bVar1 = std::ios::fail();
  if ((bVar1 & 1) == 0) {
    return;
  }
  std::__cxx11::ostringstream::ostringstream(local_198);
  poVar3 = std::operator<<((ostream *)local_198,"Unable to open file: \'");
  poVar3 = std::operator<<(poVar3,local_10);
  std::operator<<(poVar3,"\'");
  this_00 = (domain_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::ostringstream::str();
  std::domain_error::domain_error(this_00,local_1b8);
  __cxa_throw(this_00,&std::domain_error::typeinfo,std::domain_error::~domain_error);
}

Assistant:

FileStream::FileStream( std::string const& filename ) {
        m_ofs.open( filename.c_str() );
        if( m_ofs.fail() ) {
            std::ostringstream oss;
            oss << "Unable to open file: '" << filename << "'";
            throw std::domain_error( oss.str() );
        }
    }